

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

void __thiscall CBlockPolicyEstimator::FlushUnconfirmed(CBlockPolicyEstimator *this)

{
  size_t sVar1;
  string_view source_file;
  bool bVar2;
  long lVar3;
  long lVar4;
  Logger *pLVar5;
  double *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  size_t num_entries;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  string log_msg;
  double local_f0;
  size_t local_e8 [2];
  unique_lock<std::mutex> local_d8 [7];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = std::chrono::_V2::steady_clock::now();
  local_d8[0]._M_device = &(this->m_cs_fee_estimator).super_mutex;
  local_d8[0]._M_owns = false;
  std::unique_lock<std::mutex>::lock(local_d8);
  local_e8[0] = (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  sVar1 = local_e8[0];
  while (sVar1 != 0) {
    _removeTx(this,(uint256 *)
                   ((this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1),
              false);
    sVar1 = (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  pLVar5 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar5,ESTIMATEFEE,Debug);
  if (bVar2) {
    local_f0 = (double)(lVar4 - lVar3) / 1000000000.0;
    pLVar5 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar5);
    if (bVar2) {
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      tinyformat::format<unsigned_long,double>
                (&local_68,(tinyformat *)"Recorded %u unconfirmed txs from mempool in %.3fs\n",
                 (char *)local_e8,(unsigned_long *)&local_f0,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_48,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      pLVar5 = LogInstance();
      local_68._M_dataplus._M_p = (pointer)0x58;
      local_68._M_string_length = 0x81cc4d;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = local_48._M_dataplus._M_p;
      str._M_len = local_48._M_string_length;
      logging_function._M_str = "FlushUnconfirmed";
      logging_function._M_len = 0x10;
      BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x422,ESTIMATEFEE,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                 local_48.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CBlockPolicyEstimator::FlushUnconfirmed()
{
    const auto startclear{SteadyClock::now()};
    LOCK(m_cs_fee_estimator);
    size_t num_entries = mapMemPoolTxs.size();
    // Remove every entry in mapMemPoolTxs
    while (!mapMemPoolTxs.empty()) {
        auto mi = mapMemPoolTxs.begin();
        _removeTx(mi->first, false); // this calls erase() on mapMemPoolTxs
    }
    const auto endclear{SteadyClock::now()};
    LogDebug(BCLog::ESTIMATEFEE, "Recorded %u unconfirmed txs from mempool in %.3fs\n", num_entries, Ticks<SecondsDouble>(endclear - startclear));
}